

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* mocker::buildBlockPredecessors
            (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *__return_storage_ptr__,FunctionModule *func)

{
  iterator __position;
  pointer puVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar2;
  mapped_type *this;
  unsigned_long *s;
  _List_node_base *__k;
  BasicBlockList *pBVar3;
  _List_node_base *p_Var4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> succ;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  size_t local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var4 = (func->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  pBVar3 = &func->bbs;
  if (p_Var4 != (_List_node_base *)pBVar3) {
    do {
      local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Var4[1]._M_next;
      pvVar2 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)__return_storage_ptr__,(key_type *)&local_50);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long_const*>
                (pvVar2,0,0);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)pBVar3);
    p_Var4 = (pBVar3->
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
             _M_impl._M_node.super__List_node_base._M_next;
  }
  for (; p_Var4 != (_List_node_base *)pBVar3; p_Var4 = p_Var4->_M_next) {
    ir::BasicBlock::getSuccessors(&local_50,(BasicBlock *)(p_Var4 + 1));
    puVar1 = local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (_List_node_base *)
               local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start; __k != (_List_node_base *)puVar1;
        __k = (_List_node_base *)&__k->_M_prev) {
      this = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)__k);
      local_38 = ((BasicBlock *)(p_Var4 + 1))->labelID;
      __position._M_current =
           (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (this,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    if ((_List_node_base *)
        local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (_List_node_base *)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_map<std::size_t, std::vector<std::size_t>>
buildBlockPredecessors(const ir::FunctionModule &func) {
  std::unordered_map<std::size_t, std::vector<std::size_t>> res;
  for (auto &bb : func.getBBs())
    res[bb.getLabelID()] = {};

  for (auto &bb : func.getBBs()) {
    auto succ = bb.getSuccessors();
    for (auto &s : succ)
      res[s].emplace_back(bb.getLabelID());
  }

  return res;
}